

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interactions.cc
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* INTERACTIONS::expand_interactions
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *vec,size_t required_length,string *err_msg)

{
  pointer pbVar1;
  ostream *poVar2;
  vw_exception *pvVar3;
  pointer ns;
  string local_1f8;
  string local_1d8;
  string temp;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ns = (vec->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (vec->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (ns == pbVar1) {
      return __return_storage_ptr__;
    }
    if (ns->_M_string_length != required_length && required_length != 0) break;
    if (ns->_M_string_length < 2) {
      std::__cxx11::stringstream::stringstream((stringstream *)&temp);
      poVar2 = std::operator<<((ostream *)&temp.field_2,
                               "error, feature interactions must involve at least two namespaces");
      std::operator<<(poVar2,(string *)err_msg);
      pvVar3 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/interactions.cc"
                 ,0x49,&local_1f8);
      __cxa_throw(pvVar3,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    temp._M_string_length = 0;
    temp.field_2._M_local_buf[0] = '\0';
    temp._M_dataplus._M_p = (pointer)&temp.field_2;
    expand_namespaces_with_recursion(ns,__return_storage_ptr__,&temp,0);
    std::__cxx11::string::~string((string *)&temp);
    ns = ns + 1;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&temp);
  std::operator<<((ostream *)&temp.field_2,(string *)err_msg);
  pvVar3 = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  VW::vw_exception::vw_exception
            (pvVar3,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/interactions.cc"
             ,0x45,&local_1d8);
  __cxa_throw(pvVar3,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

std::vector<std::string> expand_interactions(
    const vector<string>& vec, const size_t required_length, const string& err_msg)
{
  std::vector<std::string> res;

  for (string const& i : vec)
  {
    const size_t len = i.length();
    if (required_length > 0 && len != required_length)
    // got strict requirement of interaction length and it was failed.
    {
      THROW(err_msg);
    }
    else if (len < 2)
      // regardles of required_length value this check is always performed
      THROW("error, feature interactions must involve at least two namespaces" << err_msg);

    std::string temp;
    expand_namespaces_with_recursion(i, res, temp, 0);
  }
  return res;
}